

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expanddims.cpp
# Opt level: O3

int __thiscall ncnn::ExpandDims::load_param(ExpandDims *this,ParamDict *pd)

{
  void *__ptr;
  Allocator *pAVar1;
  int iVar2;
  int *piVar3;
  Mat local_b8;
  Mat local_68;
  
  iVar2 = ParamDict::get(pd,0,0);
  this->expand_w = iVar2;
  iVar2 = ParamDict::get(pd,1,0);
  this->expand_h = iVar2;
  iVar2 = ParamDict::get(pd,0xb,0);
  this->expand_d = iVar2;
  iVar2 = ParamDict::get(pd,2,0);
  this->expand_c = iVar2;
  local_68.cstep = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.d = 0;
  local_68.c = 0;
  ParamDict::get(&local_b8,pd,3,&local_68);
  piVar3 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (&this->axes != &local_b8) {
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = (this->axes).refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        __ptr = (this->axes).data;
        pAVar1 = (this->axes).allocator;
        if (pAVar1 == (Allocator *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (*pAVar1->_vptr_Allocator[3])();
        }
      }
    }
    (this->axes).data = local_b8.data;
    piVar3 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    (this->axes).refcount = piVar3;
    (this->axes).elemsize = CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
    (this->axes).elempack = local_b8.elempack;
    (this->axes).allocator = local_b8.allocator;
    (this->axes).dims = local_b8.dims;
    (this->axes).w = local_b8.w;
    (this->axes).h = local_b8.h;
    (this->axes).d = local_b8.d;
    (this->axes).c = local_b8.c;
    (this->axes).cstep = local_b8.cstep;
  }
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  piVar3 = (int *)CONCAT44(local_68.refcount._4_4_,local_68.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_68.allocator == (Allocator *)0x0) {
        if (local_68.data != (void *)0x0) {
          free(local_68.data);
        }
      }
      else {
        (*(local_68.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int ExpandDims::load_param(const ParamDict& pd)
{
    expand_w = pd.get(0, 0);
    expand_h = pd.get(1, 0);
    expand_d = pd.get(11, 0);
    expand_c = pd.get(2, 0);
    axes = pd.get(3, Mat());

    return 0;
}